

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool __thiscall cmSystemTools::EnvDiff::ParseOperation(EnvDiff *this,string *envmod)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  bool bVar1;
  optional<std::__cxx11::string> *this_00;
  mapped_type *pmVar2;
  basic_string_view<char,_std::char_traits<char>_> __y;
  char local_409;
  string local_408;
  anon_class_8_1_a8c68091 local_3e8;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_3e0;
  basic_string_view<char,_std::char_traits<char>_> local_3c0;
  basic_string_view<char,_std::char_traits<char>_> local_3b0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_3a0;
  anon_class_8_1_a8c68091 local_390;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_388;
  basic_string_view<char,_std::char_traits<char>_> local_368;
  basic_string_view<char,_std::char_traits<char>_> local_358;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_348;
  anon_class_16_2_43d9f52a local_338;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_328;
  basic_string_view<char,_std::char_traits<char>_> local_308;
  basic_string_view<char,_std::char_traits<char>_> local_2f8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_2e8;
  anon_class_16_2_43d9f52a local_2d8;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_2c8;
  basic_string_view<char,_std::char_traits<char>_> local_2a8;
  basic_string_view<char,_std::char_traits<char>_> local_298;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_288;
  anon_class_8_1_a8c68091 local_278;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_270;
  basic_string_view<char,_std::char_traits<char>_> local_250;
  basic_string_view<char,_std::char_traits<char>_> local_240;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_230;
  anon_class_8_1_a8c68091 local_220;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_218;
  basic_string_view<char,_std::char_traits<char>_> local_1f8;
  basic_string_view<char,_std::char_traits<char>_> local_1e8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1d8;
  basic_string_view<char,_std::char_traits<char>_> local_1c0;
  basic_string_view<char,_std::char_traits<char>_> local_1b0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1a0;
  basic_string_view<char,_std::char_traits<char>_> local_190;
  basic_string_view<char,_std::char_traits<char>_> local_180;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_170;
  _Base_ptr local_160;
  _Base_ptr local_158;
  _Self local_150;
  _Self local_148;
  iterator entry;
  undefined1 local_110 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  size_type value_start;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> op;
  string local_c0;
  long local_a0;
  size_type colon_loc;
  size_type op_value_start;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  char local_59;
  string local_58;
  long local_38;
  size_type eq_loc;
  anon_class_8_1_8991fb9c apply_diff;
  char path_sep;
  string *envmod_local;
  EnvDiff *this_local;
  
  apply_diff.this._7_1_ = GetSystemPathlistSeparator();
  eq_loc = (size_type)this;
  local_38 = std::__cxx11::string::find_first_of((char)envmod,0x3d);
  if (local_38 == -1) {
    local_59 = '\n';
    cmStrCat<char_const(&)[48],std::__cxx11::string_const&,char>
              (&local_58,(char (*) [48])"Error: Missing `=` after the variable name in: ",envmod,
               &local_59);
    Error(&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    return false;
  }
  std::__cxx11::string::substr((ulong)&op_value_start,(ulong)envmod);
  colon_loc = local_38 + 1;
  local_a0 = std::__cxx11::string::find_first_of((char)envmod,0x3a);
  if (local_a0 == -1) {
    op.field_2._M_local_buf[0xf] = '\n';
    cmStrCat<char_const(&)[44],std::__cxx11::string_const&,char>
              (&local_c0,(char (*) [44])"Error: Missing `:` after the operation in: ",envmod,
               op.field_2._M_local_buf + 0xf);
    Error(&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    this_local._7_1_ = false;
    op.field_2._8_4_ = 1;
    goto LAB_0011afd7;
  }
  std::__cxx11::string::substr((ulong)&value_start,(ulong)envmod);
  value.field_2._8_8_ = local_a0 + 1;
  std::__cxx11::string::substr((ulong)local_110,(ulong)envmod);
  __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
        std::__cxx11::string::operator_cast_to_basic_string_view((string *)&value_start);
  __y = (basic_string_view<char,_std::char_traits<char>_>)cm::operator____s("reset",5);
  entry._M_node = (_Base_ptr)__y._M_len;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    local_148._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::find(&this->diff,(key_type *)&op_value_start);
    local_150._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::end(&this->diff);
    bVar1 = std::operator!=(&local_148,&local_150);
    if (bVar1) {
      local_158 = local_148._M_node;
      local_160 = (_Base_ptr)
                  std::
                  map<std::__cxx11::string,std::optional<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                  ::erase_abi_cxx11_((map<std::__cxx11::string,std::optional<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                                      *)this,local_148._M_node);
    }
LAB_0011af95:
    this_local._7_1_ = true;
  }
  else {
    local_170 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&value_start);
    local_190 = (basic_string_view<char,_std::char_traits<char>_>)cm::operator____s("set",3);
    local_180 = local_190;
    bVar1 = std::operator==(local_170,local_190);
    if (bVar1) {
      this_00 = (optional<std::__cxx11::string> *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator[](&this->diff,(key_type *)&op_value_start);
      std::optional<std::__cxx11::string>::operator=
                (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_110);
      goto LAB_0011af95;
    }
    local_1a0 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&value_start);
    local_1c0 = (basic_string_view<char,_std::char_traits<char>_>)cm::operator____s("unset",5);
    local_1b0 = local_1c0;
    bVar1 = std::operator==(local_1a0,local_1c0);
    if (bVar1) {
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&this->diff,(key_type *)&op_value_start);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(pmVar2);
      goto LAB_0011af95;
    }
    local_1d8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&value_start);
    local_1f8 = (basic_string_view<char,_std::char_traits<char>_>)
                cm::operator____s("string_append",0xd);
    local_1e8 = local_1f8;
    bVar1 = std::operator==(local_1d8,local_1f8);
    if (bVar1) {
      local_220.value =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110;
      std::function<void(std::__cxx11::string&)>::
      function<cmSystemTools::EnvDiff::ParseOperation(std::__cxx11::string_const&)::__0,void>
                ((function<void(std::__cxx11::string&)> *)&local_218,&local_220);
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)&eq_loc,(string *)&op_value_start,&local_218);
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_218);
      goto LAB_0011af95;
    }
    local_230 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&value_start);
    local_250 = (basic_string_view<char,_std::char_traits<char>_>)
                cm::operator____s("string_prepend",0xe);
    local_240 = local_250;
    bVar1 = std::operator==(local_230,local_250);
    if (bVar1) {
      local_278.value =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110;
      std::function<void(std::__cxx11::string&)>::
      function<cmSystemTools::EnvDiff::ParseOperation(std::__cxx11::string_const&)::__1,void>
                ((function<void(std::__cxx11::string&)> *)&local_270,&local_278);
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)&eq_loc,(string *)&op_value_start,&local_270);
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_270);
      goto LAB_0011af95;
    }
    local_288 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&value_start);
    local_2a8 = (basic_string_view<char,_std::char_traits<char>_>)
                cm::operator____s("path_list_append",0x10);
    local_298 = local_2a8;
    bVar1 = std::operator==(local_288,local_2a8);
    if (bVar1) {
      local_2d8.value =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110;
      local_2d8.path_sep = apply_diff.this._7_1_;
      std::function<void(std::__cxx11::string&)>::
      function<cmSystemTools::EnvDiff::ParseOperation(std::__cxx11::string_const&)::__2,void>
                ((function<void(std::__cxx11::string&)> *)&local_2c8,&local_2d8);
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)&eq_loc,(string *)&op_value_start,&local_2c8);
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_2c8);
      goto LAB_0011af95;
    }
    local_2e8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&value_start);
    local_308 = (basic_string_view<char,_std::char_traits<char>_>)
                cm::operator____s("path_list_prepend",0x11);
    local_2f8 = local_308;
    bVar1 = std::operator==(local_2e8,local_308);
    if (bVar1) {
      local_338.value =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110;
      local_338.path_sep = apply_diff.this._7_1_;
      std::function<void(std::__cxx11::string&)>::
      function<cmSystemTools::EnvDiff::ParseOperation(std::__cxx11::string_const&)::__3,void>
                ((function<void(std::__cxx11::string&)> *)&local_328,&local_338);
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)&eq_loc,(string *)&op_value_start,&local_328);
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_328);
      goto LAB_0011af95;
    }
    local_348 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&value_start);
    local_368 = (basic_string_view<char,_std::char_traits<char>_>)
                cm::operator____s("cmake_list_append",0x11);
    local_358 = local_368;
    bVar1 = std::operator==(local_348,local_368);
    if (bVar1) {
      local_390.value =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110;
      std::function<void(std::__cxx11::string&)>::
      function<cmSystemTools::EnvDiff::ParseOperation(std::__cxx11::string_const&)::__4,void>
                ((function<void(std::__cxx11::string&)> *)&local_388,&local_390);
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)&eq_loc,(string *)&op_value_start,&local_388);
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_388);
      goto LAB_0011af95;
    }
    local_3a0 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&value_start);
    local_3c0 = (basic_string_view<char,_std::char_traits<char>_>)
                cm::operator____s("cmake_list_prepend",0x12);
    local_3b0 = local_3c0;
    bVar1 = std::operator==(local_3a0,local_3c0);
    if (bVar1) {
      local_3e8.value =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110;
      std::function<void(std::__cxx11::string&)>::
      function<cmSystemTools::EnvDiff::ParseOperation(std::__cxx11::string_const&)::__5,void>
                ((function<void(std::__cxx11::string&)> *)&local_3e0,&local_3e8);
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)&eq_loc,(string *)&op_value_start,&local_3e0);
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_3e0);
      goto LAB_0011af95;
    }
    local_409 = '\n';
    cmStrCat<char_const(&)[56],std::__cxx11::string_const&,char>
              (&local_408,(char (*) [56])"Error: Unrecognized environment manipulation argument: ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_start,
               &local_409);
    Error(&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    this_local._7_1_ = false;
  }
  op.field_2._8_4_ = 1;
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)&value_start);
LAB_0011afd7:
  std::__cxx11::string::~string((string *)&op_value_start);
  return this_local._7_1_;
}

Assistant:

bool cmSystemTools::EnvDiff::ParseOperation(const std::string& envmod)
{
  char path_sep = GetSystemPathlistSeparator();

  auto apply_diff = [this](const std::string& name,
                           std::function<void(std::string&)> const& apply) {
    cm::optional<std::string> old_value = diff[name];
    std::string output;
    if (old_value) {
      output = *old_value;
    } else {
      const char* curval = cmSystemTools::GetEnv(name);
      if (curval) {
        output = curval;
      }
    }
    apply(output);
    diff[name] = output;
  };

  // Split on `=`
  auto const eq_loc = envmod.find_first_of('=');
  if (eq_loc == std::string::npos) {
    cmSystemTools::Error(cmStrCat(
      "Error: Missing `=` after the variable name in: ", envmod, '\n'));
    return false;
  }

  auto const name = envmod.substr(0, eq_loc);

  // Split value on `:`
  auto const op_value_start = eq_loc + 1;
  auto const colon_loc = envmod.find_first_of(':', op_value_start);
  if (colon_loc == std::string::npos) {
    cmSystemTools::Error(
      cmStrCat("Error: Missing `:` after the operation in: ", envmod, '\n'));
    return false;
  }
  auto const op = envmod.substr(op_value_start, colon_loc - op_value_start);

  auto const value_start = colon_loc + 1;
  auto const value = envmod.substr(value_start);

  // Determine what to do with the operation.
  if (op == "reset"_s) {
    auto entry = diff.find(name);
    if (entry != diff.end()) {
      diff.erase(entry);
    }
  } else if (op == "set"_s) {
    diff[name] = value;
  } else if (op == "unset"_s) {
    diff[name] = cm::nullopt;
  } else if (op == "string_append"_s) {
    apply_diff(name, [&value](std::string& output) { output += value; });
  } else if (op == "string_prepend"_s) {
    apply_diff(name,
               [&value](std::string& output) { output.insert(0, value); });
  } else if (op == "path_list_append"_s) {
    apply_diff(name, [&value, path_sep](std::string& output) {
      if (!output.empty()) {
        output += path_sep;
      }
      output += value;
    });
  } else if (op == "path_list_prepend"_s) {
    apply_diff(name, [&value, path_sep](std::string& output) {
      if (!output.empty()) {
        output.insert(output.begin(), path_sep);
      }
      output.insert(0, value);
    });
  } else if (op == "cmake_list_append"_s) {
    apply_diff(name, [&value](std::string& output) {
      if (!output.empty()) {
        output += ';';
      }
      output += value;
    });
  } else if (op == "cmake_list_prepend"_s) {
    apply_diff(name, [&value](std::string& output) {
      if (!output.empty()) {
        output.insert(output.begin(), ';');
      }
      output.insert(0, value);
    });
  } else {
    cmSystemTools::Error(cmStrCat(
      "Error: Unrecognized environment manipulation argument: ", op, '\n'));
    return false;
  }

  return true;
}